

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::LeftoverBuffer::append
          (LeftoverBuffer *this,string_view from)

{
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_30;
  unsigned_long local_20;
  
  local_30.super_LogMessage._0_8_ = (ulong)this->size + from._M_len;
  local_20 = 4;
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&local_30,&local_20,"size + from.size() <= kUtfMax");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    UnrolledMemcpy(this->buffer + this->size,from._M_str,from._M_len);
    this->size = this->size + (int)from._M_len;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
             ,0xff,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

void LeftoverBuffer::append(absl::string_view from) {
  ABSL_DCHECK_LE(size + from.size(), kUtfMax);

  UnrolledMemcpy(buffer + size, from.data(), from.size());
  size += from.size();
}